

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltException.cpp
# Opt level: O2

void __thiscall NoViableAltException::NoViableAltException(NoViableAltException *this,RefAST *t)

{
  Ref *pRVar1;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"NoViableAlt",&local_39);
  ParserException::ParserException(&this->super_ParserException,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&(this->super_ParserException).super_ANTLRException =
       &PTR__NoViableAltException_00213ad8;
  (this->token).ref = (Ref *)0x0;
  pRVar1 = t->ref;
  if (pRVar1 != (Ref *)0x0) {
    pRVar1->count = pRVar1->count + 1;
  }
  (this->node).ref = pRVar1;
  return;
}

Assistant:

NoViableAltException::NoViableAltException(RefAST t)
: ParserException("NoViableAlt")
, token(0)
, node(t)
{
}